

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void cs::compiler_type::dump_expr(iterator it,ostream *stream)

{
  bool bVar1;
  int iVar2;
  token_base **pptVar3;
  iterator in_RSI;
  iterator *in_stack_00000010;
  iterator *in_stack_00000018;
  bool cutoff;
  iterator local_30;
  tree_node *local_28;
  iterator local_20;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar4;
  iterator local_8;
  
  bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_8);
  if (bVar1) {
    std::operator<<((ostream *)in_RSI.mData,"<");
    bVar4 = 0;
    pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_00000010);
    if (*pptVar3 != (token_base *)0x0) {
      std::operator<<((ostream *)in_RSI.mData," Tree Node = ");
      pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_00000010);
      iVar2 = (*(*pptVar3)->_vptr_token_base[4])(*pptVar3,in_RSI.mData);
      bVar4 = (byte)iVar2 & 1;
    }
    if ((bVar4 & 1) == 0) {
      local_20 = tree_type<cs::token_base_*>::iterator::left(in_stack_00000018);
      bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_20);
      if (bVar1) {
        std::operator<<((ostream *)in_RSI.mData," Left Leaf = ");
        local_28 = (tree_node *)tree_type<cs::token_base_*>::iterator::left(in_stack_00000018);
        dump_expr(in_RSI,(ostream *)CONCAT17(bVar4,in_stack_ffffffffffffffe8));
      }
      local_30 = tree_type<cs::token_base_*>::iterator::right(in_stack_00000018);
      bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_30);
      if (bVar1) {
        std::operator<<((ostream *)in_RSI.mData," Right Leaf = ");
        tree_type<cs::token_base_*>::iterator::right(in_stack_00000018);
        dump_expr(in_RSI,(ostream *)CONCAT17(bVar4,in_stack_ffffffffffffffe8));
      }
    }
    std::operator<<((ostream *)in_RSI.mData," >");
  }
  else {
    std::operator<<((ostream *)in_RSI.mData,"< Empty Expression >");
  }
  return;
}

Assistant:

void compiler_type::dump_expr(tree_type<token_base *>::iterator it, std::ostream &stream)
	{
		if (!it.usable()) {
			stream << "< Empty Expression >";
			return;
		}
		stream << "<";
		bool cutoff = false;
		if (it.data() != nullptr) {
			stream << " Tree Node = ";
			cutoff = it.data()->dump(stream);
		}
		if (!cutoff) {
			if (it.left().usable()) {
				stream << " Left Leaf = ";
				dump_expr(it.left(), stream);
			}
			if (it.right().usable()) {
				stream << " Right Leaf = ";
				dump_expr(it.right(), stream);
			}
		}
		stream << " >";
	}